

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Expression> __thiscall Parser::castable(Parser *this)

{
  bool bVar1;
  undefined8 extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  __shared_ptr<Cast,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  unary(this);
  bVar1 = match(in_RSI,As);
  _Var2._M_pi = extraout_RDX;
  if (bVar1) {
    consume(in_RSI);
    bVar1 = match(in_RSI,StringType);
    if (bVar1) {
      consume(in_RSI);
      std::make_shared<Cast,std::shared_ptr<Expression>&,Type&>
                ((shared_ptr<Expression> *)&local_20,(Type *)this);
    }
    else {
      bVar1 = match(in_RSI,DoubleType);
      if (bVar1) {
        consume(in_RSI);
        std::make_shared<Cast,std::shared_ptr<Expression>&,Type&>
                  ((shared_ptr<Expression> *)&local_20,(Type *)this);
      }
      else {
        bVar1 = match(in_RSI,IntegerType);
        if (bVar1) {
          consume(in_RSI);
          std::make_shared<Cast,std::shared_ptr<Expression>&,Type&>
                    ((shared_ptr<Expression> *)&local_20,(Type *)this);
        }
        else {
          bVar1 = match(in_RSI,BooleanType);
          if (!bVar1) {
            unexpected(in_RSI);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &(this->filepath)._M_string_length);
            _Unwind_Resume(extraout_RAX);
          }
          consume(in_RSI);
          std::make_shared<Cast,std::shared_ptr<Expression>&,Type&>
                    ((shared_ptr<Expression> *)&local_20,(Type *)this);
        }
      }
    }
    std::__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::castable() {
    ptr<Expression> expr = unary();

    if(match(TokenType::As)) {
        consume();

        if(match(TokenType::StringType)) {
            consume();
            expr = make<Cast>(expr, Type::String);
        } else if(match(TokenType::DoubleType)) {
            consume();
            expr = make<Cast>(expr, Type::Double);
        } else if(match(TokenType::IntegerType)) {
            consume();
            expr = make<Cast>(expr, Type::Integer);
        } else if(match(TokenType::BooleanType)) {
            consume();
            expr = make<Cast>(expr, Type::Boolean);
        } else {
            unexpected();
        }
    }

    return expr;
}